

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

void Abc_End(Abc_Frame_t *pAbc)

{
  int iVar1;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameClearDesign();
  Cnf_ManFree();
  Abc_NtkCompareAndSaveBest((Abc_Ntk_t *)0x0);
  Dar_LibStop();
  Aig_RManQuit();
  Npn_ManClean();
  Sdm_ManQuit();
  Abc_NtkFraigStoreClean();
  Gia_ManStopP(&pAbc->pGia);
  Gia_ManStopP(&pAbc->pGia2);
  Gia_ManStopP(&pAbc->pGiaBest);
  Gia_ManStopP(&pAbc->pGiaBest2);
  Gia_ManStopP(&pAbc->pGiaSaved);
  iVar1 = Abc_NtkRecIsRunning3();
  if (iVar1 != 0) {
    Abc_NtkRecStop3();
  }
  return;
}

Assistant:

void Abc_End( Abc_Frame_t * pAbc )
{
    extern Abc_Frame_t * Abc_FrameGetGlobalFrame();
    Abc_FrameClearDesign();
    Cnf_ManFree();
    {
        extern int Abc_NtkCompareAndSaveBest( Abc_Ntk_t * pNtk );
        Abc_NtkCompareAndSaveBest( NULL );
    }
    {
        extern void Dar_LibStop();
        Dar_LibStop();
    }
    {
        extern void Aig_RManQuit();
        Aig_RManQuit();
    }
    {
        extern void Npn_ManClean();
        Npn_ManClean();
    }
    {
        extern void Sdm_ManQuit();
        Sdm_ManQuit();
    }
    Abc_NtkFraigStoreClean();
    Gia_ManStopP( &pAbc->pGia );
    Gia_ManStopP( &pAbc->pGia2 );
    Gia_ManStopP( &pAbc->pGiaBest );
    Gia_ManStopP( &pAbc->pGiaBest2 );
    Gia_ManStopP( &pAbc->pGiaSaved );
    if ( Abc_NtkRecIsRunning3() )
        Abc_NtkRecStop3();
}